

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

QWidget * __thiscall QFormLayout::labelForField(QFormLayout *this,QWidget *field)

{
  long lVar1;
  undefined8 *puVar2;
  int index;
  QWidget *pQVar3;
  long in_FS_OFFSET;
  ItemRole role;
  int row;
  ItemRole local_30;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  local_2c = -0x55555556;
  local_30 = LabelRole;
  index = (**(code **)(*(long *)&this->super_QLayout + 0xb8))();
  getItemPosition(this,index,&local_2c,&local_30);
  pQVar3 = (QWidget *)0x0;
  if (((long)local_2c != -1) && (local_30 == FieldRole)) {
    puVar2 = *(undefined8 **)(*(long *)(lVar1 + 200) + (long)local_2c * 0x10);
    if (puVar2 == (undefined8 *)0x0) {
      pQVar3 = (QWidget *)0x0;
    }
    else {
      pQVar3 = (QWidget *)(**(code **)(*(long *)*puVar2 + 0x68))();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QFormLayout::labelForField(QWidget *field) const
{
    Q_D(const QFormLayout);

    int row;
    ItemRole role = LabelRole;

    getWidgetPosition(field, &row, &role);

    if (row != -1 && role == FieldRole) {
        if (QFormLayoutItem *label = d->m_matrix(row, LabelRole))
            return label->widget();
    }
    return nullptr;
}